

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanObjectWrappers.hpp
# Opt level: O2

VulkanObjectWrapper<VkRenderPass_T_*,_(VulkanUtilities::VulkanHandleTypeId)8> * __thiscall
VulkanUtilities::VulkanObjectWrapper<VkRenderPass_T_*,_(VulkanUtilities::VulkanHandleTypeId)8>::
operator=(VulkanObjectWrapper<VkRenderPass_T_*,_(VulkanUtilities::VulkanHandleTypeId)8> *this,
         VulkanObjectWrapper<VkRenderPass_T_*,_(VulkanUtilities::VulkanHandleTypeId)8> *rhs)

{
  Release(this);
  std::__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>::
  operator=((__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> *)
            this,(__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                  *)rhs);
  this->m_VkObject = rhs->m_VkObject;
  rhs->m_VkObject = (VkRenderPass_T *)0x0;
  return this;
}

Assistant:

VulkanObjectWrapper& operator=(VulkanObjectWrapper&& rhs) noexcept
    {
        Release();
        m_pLogicalDevice = std::move(rhs.m_pLogicalDevice);
        m_VkObject       = rhs.m_VkObject;
        rhs.m_VkObject   = VK_NULL_HANDLE;
        return *this;
    }